

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void movd_EP(PDISASM pMyDisasm)

{
  char *pcVar1;
  Int32 IVar2;
  _Bool _Var3;
  
  if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    if ((pMyDisasm->Reserved_).VEX.pp != '\x01') {
LAB_0011d919:
      failDecode(pMyDisasm);
      return;
    }
    if ((pMyDisasm->Reserved_).EVEX.state != '\x01') {
      (pMyDisasm->Instruction).Category = 0x110001;
      if ((pMyDisasm->Reserved_).REX.W_ == '\0') goto LAB_0011d8fe;
LAB_0011d873:
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vmovq",6);
      goto LAB_0011d8e6;
    }
    (pMyDisasm->Instruction).Category = 0x140001;
    (pMyDisasm->Reserved_).EVEX.tupletype = '\x06';
    if ((pMyDisasm->Reserved_).EVEX.W != '\0') goto LAB_0011d873;
LAB_0011d8fe:
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"vmovd",6);
LAB_0011d92c:
    IVar2 = 3;
LAB_0011d92e:
    (pMyDisasm->Reserved_).MemDecoration = IVar2;
  }
  else {
    (pMyDisasm->Instruction).Category = 0x30001;
    if ((pMyDisasm->Reserved_).PrefRepe != 1) {
      if ((pMyDisasm->Prefix).OperandSize != '\x01') {
        _Var3 = prefixes_present(pMyDisasm);
        if (_Var3) goto LAB_0011d919;
        pcVar1 = (pMyDisasm->Instruction).Mnemonic;
        if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
          builtin_strncpy(pcVar1,"movq",5);
          IVar2 = 4;
        }
        else {
          builtin_strncpy(pcVar1,"movd",5);
          IVar2 = 3;
        }
        (pMyDisasm->Reserved_).MemDecoration = IVar2;
        decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
        (pMyDisasm->Reserved_).Register_ = 2;
        goto LAB_0011d94e;
      }
      (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
      (pMyDisasm->Prefix).OperandSize = '\b';
      pcVar1 = (pMyDisasm->Instruction).Mnemonic;
      if ((pMyDisasm->Reserved_).REX.W_ != '\x01') {
        builtin_strncpy(pcVar1,"movd",5);
        goto LAB_0011d92c;
      }
      builtin_strncpy(pcVar1,"movq",5);
LAB_0011d8e6:
      IVar2 = 4;
      goto LAB_0011d92e;
    }
    (pMyDisasm->Prefix).RepPrefix = '\b';
    (pMyDisasm->Reserved_).MemDecoration = 0x68;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"movq",5);
  }
  decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
  (pMyDisasm->Reserved_).Register_ = 4;
LAB_0011d94e:
  decodeRegOpcode(&pMyDisasm->Operand2,pMyDisasm);
  (pMyDisasm->Reserved_).EIP_ =
       (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
  return;
}

Assistant:

void __bea_callspec__ movd_EP(PDISASM pMyDisasm)
{
  if (GV.VEX.state == InUsePrefix) {
    if (GV.VEX.pp == 1) {
      if (GV.EVEX.state == InUsePrefix) {
        pMyDisasm->Instruction.Category = AVX512_INSTRUCTION+DATA_TRANSFER;
        GV.EVEX.tupletype = TUPLE1_SCALAR;
      }
      else {
        pMyDisasm->Instruction.Category = AVX_INSTRUCTION+DATA_TRANSFER;
      }
      if (
        ((GV.EVEX.state != InUsePrefix) && (GV.REX.W_ == 0)) ||
        ((GV.EVEX.state == InUsePrefix) && (GV.EVEX.W == 0))
        ) {
        #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vmovd");
        #endif
        GV.MemDecoration = Arg1dword;
      }
      else {
        #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vmovq");
        #endif
        GV.MemDecoration = Arg1qword;
      }
      decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
      GV.Register_ = SSE_REG;
      decodeRegOpcode(&pMyDisasm->Operand2, pMyDisasm);
      GV.EIP_ += GV.DECALAGE_EIP+2;
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {

    pMyDisasm->Instruction.Category = MMX_INSTRUCTION+DATA_TRANSFER;
    /* ========= 0xf3 */
    if (GV.PrefRepe == 1) {
      pMyDisasm->Prefix.RepPrefix = MandatoryPrefix;
      GV.MemDecoration = Arg2qword;
      #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "movq");
      #endif
      decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
      GV.Register_ = SSE_REG;
      decodeRegOpcode(&pMyDisasm->Operand2, pMyDisasm);
      GV.EIP_ += GV.DECALAGE_EIP+2;
    }
    /* ========== 0x66 */
    else if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
      GV.OperandSize = GV.OriginalOperandSize;
      pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
      if (GV.REX.W_ == 1) {
        GV.MemDecoration = Arg1qword;
        #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "movq");
        #endif
      }
      else {
        GV.MemDecoration = Arg1dword;
        #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "movd");
        #endif
      }
      decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
      GV.Register_ = SSE_REG;
      decodeRegOpcode(&pMyDisasm->Operand2, pMyDisasm);
      GV.EIP_ += GV.DECALAGE_EIP+2;
    }
    else {
      if (prefixes_present(pMyDisasm)) { failDecode(pMyDisasm); return; }
      if (GV.REX.W_ == 1) {
        GV.MemDecoration = Arg1qword;
        #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "movq");
        #endif
      }
      else {
        GV.MemDecoration = Arg1dword;
        #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "movd");
        #endif
      }
      decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
      GV.Register_ = MMX_REG;
      decodeRegOpcode(&pMyDisasm->Operand2, pMyDisasm);
      GV.EIP_ += GV.DECALAGE_EIP+2;
    }
  }
}